

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.c
# Opt level: O3

int luaY_nvarstack(FuncState *fs)

{
  Vardesc *pVVar1;
  uint uVar2;
  long lVar3;
  
  uVar2 = (uint)fs->nactvar;
  do {
    if ((int)uVar2 < 1) {
      return 0;
    }
    uVar2 = uVar2 - 1;
    pVVar1 = (fs->ls->dyd->actvar).arr;
    lVar3 = (long)(int)(fs->firstlocal + uVar2);
  } while (*(char *)((long)pVVar1 + lVar3 * 0x18 + 9) == '\x03');
  return (&pVVar1->vd)[lVar3].ridx + 1;
}

Assistant:

int luaY_nvarstack (FuncState *fs) {
  return reglevel(fs, fs->nactvar);
}